

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::makeGCData
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Literals *data
          ,Type type)

{
  HeapType HVar1;
  Type local_58;
  Type type_local;
  undefined1 local_48 [8];
  shared_ptr<wasm::GCData> allocation;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_58.id = type.id;
  type_local.id = (uintptr_t)Type::getHeapType(&local_58);
  std::make_shared<wasm::GCData,wasm::HeapType,wasm::Literals>
            ((HeapType *)local_48,(Literals *)&type_local);
  std::__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)
             &allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)local_48);
  HVar1 = Type::getHeapType(&local_58);
  wasm::Literal::Literal
            (__return_storage_ptr__,
             &allocation.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             HVar1.id);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&allocation);
  return __return_storage_ptr__;
}

Assistant:

Literal makeGCData(Literals&& data, Type type) {
    auto allocation =
      std::make_shared<GCData>(type.getHeapType(), std::move(data));
#if __has_feature(leak_sanitizer) || __has_feature(address_sanitizer)
    // GC data with cycles will leak, since shared_ptrs do not handle cycles.
    // Binaryen is generally not used in long-running programs so we just ignore
    // such leaks for now.
    // TODO: Add a cycle collector?
    __lsan_ignore_object(allocation.get());
#endif
    return Literal(allocation, type.getHeapType());
  }